

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void msg(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vp;
  char buf [1024];
  __va_list_tag local_4d8;
  undefined1 local_4b8 [8];
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  char local_408 [1024];
  
  local_4d8.reg_save_area = local_4b8;
  if (in_AL != '\0') {
    local_488 = in_XMM0_Qa;
    local_478 = in_XMM1_Qa;
    local_468 = in_XMM2_Qa;
    local_458 = in_XMM3_Qa;
    local_448 = in_XMM4_Qa;
    local_438 = in_XMM5_Qa;
    local_428 = in_XMM6_Qa;
    local_418 = in_XMM7_Qa;
  }
  local_4d8.gp_offset = 8;
  local_4d8.fp_offset = 0x30;
  local_4d8.overflow_arg_area = &vp[0].overflow_arg_area;
  local_4b0 = in_RSI;
  local_4a8 = in_RDX;
  local_4a0 = in_RCX;
  local_498 = in_R8;
  local_490 = in_R9;
  vstrnfmt(local_408,0x400,fmt,&local_4d8);
  if (messages != (msgqueue_t *)0x0) {
    message_add(local_408,0);
    event_signal_message(EVENT_MESSAGE,L'\0',local_408);
  }
  return;
}

Assistant:

void msg(const char *fmt, ...)
{
	va_list vp;

	char buf[1024];

	/* Begin the Varargs Stuff */
	va_start(vp, fmt);

	/* Format the args, save the length */
	(void)vstrnfmt(buf, sizeof(buf), fmt, vp);

	/* End the Varargs Stuff */
	va_end(vp);

	/* Fail if messages not loaded */
	if (!messages) return;

	/* Add to message log */
	message_add(buf, MSG_GENERIC);

	/* Send refresh event */
	event_signal_message(EVENT_MESSAGE, MSG_GENERIC, buf);

}